

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free_window(nk_context *ctx,nk_window *win)

{
  long lVar1;
  nk_context *in_RSI;
  bool bVar2;
  nk_page_element *pe;
  nk_page_data *pd;
  nk_table *it;
  nk_table *n;
  nk_table *in_stack_ffffffffffffffd8;
  nk_vec2 ctx_00;
  nk_window *in_stack_ffffffffffffffe8;
  nk_vec2 nVar3;
  
  ctx_00 = *(nk_vec2 *)((in_RSI->style).cursors + 4);
  lVar1._0_4_ = (in_RSI->input).mouse.buttons[1].clicked;
  lVar1._4_4_ = (in_RSI->input).mouse.buttons[1].clicked_pos.x;
  if (lVar1 != 0) {
    nk_free_window(in_RSI,in_stack_ffffffffffffffe8);
    (in_RSI->input).mouse.buttons[1].clicked = 0;
    (in_RSI->input).mouse.buttons[1].clicked_pos.x = 0.0;
  }
  (in_RSI->style).cursors[6] = (nk_cursor *)0x0;
  (in_RSI->style).cursor_active = (nk_cursor *)0x0;
  while (ctx_00 != (nk_vec2)0x0) {
    nVar3 = *(nk_vec2 *)((long)ctx_00 + 0x1a8);
    nk_remove_table((nk_window *)in_RSI,(nk_table *)ctx_00);
    nk_free_table((nk_context *)ctx_00,in_stack_ffffffffffffffd8);
    bVar2 = ctx_00 == (nk_vec2)(in_RSI->style).cursors[4];
    ctx_00 = nVar3;
    if (bVar2) {
      *(nk_vec2 *)((in_RSI->style).cursors + 4) = nVar3;
    }
  }
  nk_free_page_element((nk_context *)0x0,(nk_page_element *)in_RSI);
  return;
}

Assistant:

NK_INTERN void
nk_free_window(struct nk_context *ctx, struct nk_window *win)
{
    /* unlink windows from list */
    struct nk_table *n, *it = win->tables;
    if (win->popup.win) {
        nk_free_window(ctx, win->popup.win);
        win->popup.win = 0;
    }
    win->next = 0;
    win->prev = 0;

    while (it) {
        /*free window state tables */
        n = it->next;
        nk_remove_table(win, it);
        nk_free_table(ctx, it);
        if (it == win->tables)
            win->tables = n;
        it = n;
    }

    /* link windows into freelist */
    {union nk_page_data *pd = NK_CONTAINER_OF(win, union nk_page_data, win);
    struct nk_page_element *pe = NK_CONTAINER_OF(pd, struct nk_page_element, data);
    nk_free_page_element(ctx, pe);}
}